

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ExternModuleDeclSyntax::setChild
          (ExternModuleDeclSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_0047172c + *(int *)(&DAT_0047172c + in_RSI * 4)))();
  return;
}

Assistant:

void ExternModuleDeclSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: externKeyword = child.token(); return;
        case 2: actualAttributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 3: header = child.node() ? &child.node()->as<ModuleHeaderSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}